

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O0

void __thiscall
Imf_3_2::Array2D<unsigned_int>::resizeErase(Array2D<unsigned_int> *this,long sizeX,long sizeY)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  uint *tmp;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI * in_RDX;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  if ((void *)in_RDI[2] != (void *)0x0) {
    operator_delete__((void *)in_RDI[2]);
  }
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = (long)pvVar3;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}